

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O0

void __thiscall duckdb::DataChunk::Slice(DataChunk *this,idx_t offset,idx_t slice_count)

{
  ulong in_RDX;
  idx_t in_RDI;
  idx_t in_stack_00000010;
  SelectionVector *in_stack_00000018;
  idx_t i;
  SelectionVector sel;
  idx_t in_stack_ffffffffffffffb8;
  SelectionVector *in_stack_ffffffffffffffc0;
  idx_t in_stack_ffffffffffffffc8;
  ulong uVar1;
  SelectionVector *in_stack_ffffffffffffffd0;
  
  SelectionVector::SelectionVector(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  for (uVar1 = 0; uVar1 < in_RDX; uVar1 = uVar1 + 1) {
    SelectionVector::set_index(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI);
  }
  Slice((DataChunk *)i,in_stack_00000018,in_stack_00000010);
  SelectionVector::~SelectionVector((SelectionVector *)0x3b96e6);
  return;
}

Assistant:

void DataChunk::Slice(idx_t offset, idx_t slice_count) {
	D_ASSERT(offset + slice_count <= size());
	SelectionVector sel(slice_count);
	for (idx_t i = 0; i < slice_count; i++) {
		sel.set_index(i, offset + i);
	}
	Slice(sel, slice_count);
}